

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
::
find<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Entry,capnp::_::(anonymous_namespace)::TestVat*&>
          (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
           *this,ArrayPtr<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
                 table,TestVat **params)

{
  ConnectionImpl *pCVar1;
  TestVat *pTVar2;
  TestVat *pTVar3;
  TestVatBase *pTVar4;
  uint uVar5;
  ulong uVar6;
  ConnectionImpl *pCVar7;
  int iVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  pCVar1 = table.ptr[1].value;
  if (pCVar1 == (ConnectionImpl *)0x0) {
    *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
             )0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  pTVar2 = *params;
  if ((ulong)pTVar2 >> 0x20 == 0) {
    uVar5 = (uint)pTVar2 * 0x8000 + ~(uint)pTVar2;
    uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
    uVar5 = (uVar5 >> 4 ^ uVar5) * 0x809;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
  }
  else {
    uVar6 = (long)pTVar2 * 0x40000 + ~(ulong)pTVar2;
    uVar6 = (uVar6 >> 0x1f ^ uVar6) * 0x15;
    uVar6 = (uVar6 >> 0xb ^ uVar6) * 0x41;
    uVar5 = (uint)(uVar6 >> 0x16) ^ (uint)uVar6;
  }
  uVar6 = (ulong)((int)pCVar1 - 1U & uVar5);
  pTVar3 = table.ptr[1].key;
  iVar8 = *(int *)((long)&(&pTVar3->super_TestVatBase)[uVar6].super_VatNetworkBase.
                          _vptr_VatNetworkBase + 4);
  if (iVar8 != 0) {
    pTVar4 = &pTVar3->super_TestVatBase + uVar6;
    do {
      if (((iVar8 != 1) && (*(uint *)&(pTVar4->super_VatNetworkBase)._vptr_VatNetworkBase == uVar5))
         && (*(TestVat **)(MVar9.ptr.field_1.value + (ulong)(iVar8 - 2) * 0x10) == pTVar2)) {
        *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar8 - 2);
        goto LAB_00204d2c;
      }
      pCVar7 = (ConnectionImpl *)(uVar6 + 1);
      uVar6 = (ulong)pCVar7 & 0xffffffff;
      if (pCVar7 == pCVar1) {
        uVar6 = 0;
      }
      pTVar4 = &pTVar3->super_TestVatBase + uVar6;
      iVar8 = *(int *)((long)&(pTVar4->super_VatNetworkBase)._vptr_VatNetworkBase + 4);
    } while (iVar8 != 0);
  }
  *this = (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
           )0x0;
LAB_00204d2c:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }